

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_casting.hpp
# Opt level: O1

bool duckdb::CSVCast::TryCastDecimalVectorCommaSeparated
               (CSVReaderOptions *options,Vector *input_vector,Vector *result_vector,idx_t count,
               CastParameters *parameters,LogicalType *result_type,idx_t *line_error)

{
  PhysicalType PVar1;
  uint8_t width;
  uint8_t scale;
  bool bVar2;
  InternalException *this;
  string local_50;
  
  width = DecimalType::GetWidth(result_type);
  scale = DecimalType::GetScale(result_type);
  PVar1 = result_type->physical_type_;
  if (PVar1 < INT64) {
    if (PVar1 == INT16) {
      bVar2 = TemplatedTryCastDecimalVector<duckdb::TryCastToDecimalCommaSeparated,short>
                        (options,input_vector,result_vector,count,parameters,width,scale,line_error)
      ;
    }
    else {
      if (PVar1 != INT32) {
LAB_0152fb50:
        this = (InternalException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Unimplemented physical type for decimal","");
        InternalException::InternalException(this,&local_50);
        __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      bVar2 = TemplatedTryCastDecimalVector<duckdb::TryCastToDecimalCommaSeparated,int>
                        (options,input_vector,result_vector,count,parameters,width,scale,line_error)
      ;
    }
  }
  else if (PVar1 == INT64) {
    bVar2 = TemplatedTryCastDecimalVector<duckdb::TryCastToDecimalCommaSeparated,long>
                      (options,input_vector,result_vector,count,parameters,width,scale,line_error);
  }
  else {
    if (PVar1 != INT128) goto LAB_0152fb50;
    bVar2 = TemplatedTryCastDecimalVector<duckdb::TryCastToDecimalCommaSeparated,duckdb::hugeint_t>
                      (options,input_vector,result_vector,count,parameters,width,scale,line_error);
  }
  return bVar2;
}

Assistant:

static bool TryCastDecimalVectorCommaSeparated(const CSVReaderOptions &options, Vector &input_vector,
	                                               Vector &result_vector, idx_t count, CastParameters &parameters,
	                                               const LogicalType &result_type, idx_t &line_error) {
		auto width = DecimalType::GetWidth(result_type);
		auto scale = DecimalType::GetScale(result_type);
		switch (result_type.InternalType()) {
		case PhysicalType::INT16:
			return TemplatedTryCastDecimalVector<TryCastToDecimalCommaSeparated, int16_t>(
			    options, input_vector, result_vector, count, parameters, width, scale, line_error);
		case PhysicalType::INT32:
			return TemplatedTryCastDecimalVector<TryCastToDecimalCommaSeparated, int32_t>(
			    options, input_vector, result_vector, count, parameters, width, scale, line_error);
		case PhysicalType::INT64:
			return TemplatedTryCastDecimalVector<TryCastToDecimalCommaSeparated, int64_t>(
			    options, input_vector, result_vector, count, parameters, width, scale, line_error);
		case PhysicalType::INT128:
			return TemplatedTryCastDecimalVector<TryCastToDecimalCommaSeparated, hugeint_t>(
			    options, input_vector, result_vector, count, parameters, width, scale, line_error);
		default:
			throw InternalException("Unimplemented physical type for decimal");
		}
	}